

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugNodeStorage(ImGuiStorage *storage,char *label)

{
  uint uVar1;
  bool bVar2;
  ImGuiStoragePair *p;
  ImGuiStoragePair *pIVar3;
  long lVar4;
  
  uVar1 = (storage->Data).Size;
  bVar2 = TreeNode(label,"%s: %d entries, %d bytes",label,(ulong)uVar1,(ulong)(uVar1 << 4));
  if (bVar2) {
    pIVar3 = (storage->Data).Data;
    for (lVar4 = (long)(storage->Data).Size << 4; lVar4 != 0; lVar4 = lVar4 + -0x10) {
      BulletText("Key 0x%08X Value { i: %d }",(ulong)pIVar3->key,
                 (ulong)(uint)(pIVar3->field_1).val_i);
      DebugLocateItemOnHover(pIVar3->key);
      pIVar3 = pIVar3 + 1;
    }
    TreePop();
    return;
  }
  return;
}

Assistant:

void ImGui::DebugNodeStorage(ImGuiStorage* storage, const char* label)
{
    if (!TreeNode(label, "%s: %d entries, %d bytes", label, storage->Data.Size, storage->Data.size_in_bytes()))
        return;
    for (const ImGuiStoragePair& p : storage->Data)
    {
        BulletText("Key 0x%08X Value { i: %d }", p.key, p.val_i); // Important: we currently don't store a type, real value may not be integer.
        DebugLocateItemOnHover(p.key);
    }
    TreePop();
}